

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O0

address __thiscall
pstore::index::details::internal_node::store_node(internal_node *this,transaction_base *transaction)

{
  uint uVar1;
  internal_node *this_00;
  tuple<std::shared_ptr<void>&,pstore::address&> local_70 [32];
  pair<std::shared_ptr<void>,_pstore::address> local_50;
  undefined1 local_38 [8];
  shared_ptr<void> ptr;
  size_t num_bytes;
  transaction_base *transaction_local;
  internal_node *this_local;
  address result;
  
  uVar1 = size(this);
  ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)size_bytes((ulong)uVar1);
  std::shared_ptr<void>::shared_ptr((shared_ptr<void> *)local_38);
  address::address((address *)&this_local);
  transaction_base::alloc_rw
            (&local_50,transaction,
             (size_t)ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,8);
  std::tie<std::shared_ptr<void>,pstore::address>((shared_ptr<void> *)local_70,(address *)local_38);
  std::tuple<std::shared_ptr<void>&,pstore::address&>::operator=(local_70,&local_50);
  std::pair<std::shared_ptr<void>,_pstore::address>::~pair(&local_50);
  this_00 = (internal_node *)
            std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)local_38);
  internal_node(this_00,this);
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)local_38);
  return (address)(value_type)this_local;
}

Assistant:

address internal_node::store_node (transaction_base & transaction) const {
                std::size_t const num_bytes = internal_node::size_bytes (this->size ());

                std::shared_ptr<void> ptr;
                address result;
                std::tie (ptr, result) = transaction.alloc_rw (num_bytes, alignof (internal_node));
                new (ptr.get ()) internal_node (*this);
                return result;
            }